

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O0

void __thiscall
mp::StringFileWriter::Write<std::pair<char_const*,double>>
          (StringFileWriter *this,pair<const_char_*,_double> s)

{
  StrDblValue p;
  int iVar1;
  double in_RSI;
  char *in_RDI;
  int l;
  StringFileWriter *in_stack_ffffffffffffffd0;
  
  if ((in_RDI[0x30] & 1U) == 0) {
    Open(in_stack_ffffffffffffffd0);
  }
  *(int *)(in_RDI + 0x34) = *(int *)(in_RDI + 0x34) + 1;
  p.second = in_RSI;
  p.first = in_RDI;
  iVar1 = Print_ReturnLen1((StringFileWriter *)0x11299d,p);
  if (**(int **)in_RDI < iVar1) {
    **(int **)in_RDI = iVar1;
  }
  return;
}

Assistant:

void Write(Value s) {
    if (!fTriedOpen_)
      Open();
    ++cnt_;
    auto l = Print_ReturnLen1(s);
    if (l>len_max_)
      len_max_ = l;
  }